

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

Aig_Man_t * Rtm_ManRetime(Aig_Man_t *p,int fForward,int nStepsMax,int fVerbose)

{
  uint uVar1;
  Rtm_Obj_t *pObj;
  uint uVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  Rtm_Man_t *pRtm;
  void *pvVar6;
  abctime aVar7;
  Vec_Ptr_t *pVVar8;
  Rtm_Obj_t *pObj_00;
  Aig_Man_t *p_00;
  Aig_Man_t *pAVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  Rtm_Obj_t *pRVar13;
  char *pcVar14;
  
  aVar5 = Abc_Clock();
  pRtm = Rtm_ManFromAig(p);
  for (iVar10 = p->nObjs[2] - p->nRegs; iVar10 < p->vCis->nSize; iVar10 = iVar10 + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,iVar10);
    Rtm_ObjAddFirst(pRtm,(Rtm_Edg_t *)(*(long *)((long)pvVar6 + 0x28) + 0x20),
                    (uint)(fForward == 0) * 2 + RTM_VAL_ZERO);
  }
  if (fForward == 0) {
    uVar2 = Rtm_ManMarkAutoBwd(pRtm);
  }
  else {
    uVar2 = Rtm_ManMarkAutoFwd(pRtm);
  }
  if (fVerbose != 0) {
    iVar10 = 0x7e64e5;
    printf("Detected %d autonomous objects. ",(ulong)uVar2);
    Abc_Print(iVar10,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(iVar10,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
  }
  pVVar8 = pRtm->vObjs;
  iVar10 = 0;
  while( true ) {
    if (pVVar8->nSize <= iVar10) {
      aVar5 = Abc_Clock();
      pVVar8 = Vec_PtrAlloc(1000);
      if (fForward == 0) {
        for (iVar10 = p->nObjs[3] - p->nRegs; iVar10 < p->vCos->nSize; iVar10 = iVar10 + 1) {
          pvVar6 = Vec_PtrEntry(p->vCos,iVar10);
          pvVar6 = *(void **)((long)pvVar6 + 0x28);
          if ((*(uint *)((long)pvVar6 + 8) & 0x10) == 0) {
            *(uint *)((long)pvVar6 + 8) = *(uint *)((long)pvVar6 + 8) | 8;
            Vec_PtrPush(pVVar8,pvVar6);
          }
        }
      }
      else {
        for (iVar10 = p->nObjs[2] - p->nRegs; iVar10 < p->vCis->nSize; iVar10 = iVar10 + 1) {
          pvVar6 = Vec_PtrEntry(p->vCis,iVar10);
          pvVar6 = *(void **)((long)pvVar6 + 0x28);
          if ((*(uint *)((long)pvVar6 + 8) & 0x10) == 0) {
            *(uint *)((long)pvVar6 + 8) = *(uint *)((long)pvVar6 + 8) | 8;
            Vec_PtrPush(pVVar8,pvVar6);
          }
        }
      }
      iVar10 = 0;
      uVar2 = 0;
      while( true ) {
        uVar1 = pVVar8->nSize;
        if ((int)uVar1 <= iVar10) break;
        pObj_00 = (Rtm_Obj_t *)Vec_PtrEntry(pVVar8,iVar10);
        pObj_00->field_0x8 = pObj_00->field_0x8 & 0xf7;
        if (fForward == 0) {
          Rtm_ObjRetimeBwd(pRtm,pObj_00);
          pRVar13 = pObj_00 + 1;
          for (uVar12 = 0; uVar12 < (*(uint *)&pObj_00->field_0x8 >> 7 & 0xff); uVar12 = uVar12 + 1)
          {
            pObj = (Rtm_Obj_t *)pRVar13->pCopy;
            uVar1 = *(uint *)&pObj->field_0x8;
            if ((uVar1 & 0x7f80) != 0 && (char)((uVar1 & 8) >> 3) == '\0') {
              iVar11 = Rtm_ObjCheckRetimeBwd(pObj);
              if (iVar11 != 0) {
                uVar4 = Rtm_ObjGetDegreeBwd(pObj);
                if ((int)uVar2 <= (int)uVar4) {
                  uVar2 = uVar4;
                }
                if ((int)uVar4 <= nStepsMax) {
                  *(uint *)&pObj->field_0x8 = uVar4 * 0x8000 + (uVar1 & 0x7ff7) + 8;
                  Vec_PtrPush(pVVar8,pObj);
                }
              }
            }
            pRVar13 = (Rtm_Obj_t *)&pRVar13->Temp;
          }
        }
        else {
          Rtm_ObjRetimeFwd(pRtm,pObj_00);
          for (iVar11 = 0; iVar11 < pObj_00->nFanouts; iVar11 = iVar11 + 1) {
            pRVar13 = (Rtm_Obj_t *)
                      (&pObj_00[1].pCopy)[((*(uint *)&pObj_00->field_0x8 >> 7 & 0xff) + iVar11) * 2]
            ;
            uVar1 = *(uint *)&pRVar13->field_0x8;
            if ((uVar1 & 0xf) == 0) {
              iVar3 = Rtm_ObjCheckRetimeFwd(pRVar13);
              if (iVar3 != 0) {
                uVar4 = Rtm_ObjGetDegreeFwd(pRVar13);
                if ((int)uVar2 <= (int)uVar4) {
                  uVar2 = uVar4;
                }
                if ((int)uVar4 <= nStepsMax) {
                  *(uint *)&pRVar13->field_0x8 = uVar4 * 0x8000 + (uVar1 & 0x7ff0) + 8;
                  Vec_PtrPush(pVVar8,pRVar13);
                }
              }
            }
          }
        }
        iVar10 = iVar10 + 1;
      }
      if (fVerbose != 0) {
        pcVar14 = "fwd";
        if (fForward == 0) {
          pcVar14 = "bwd";
        }
        uVar4 = Rtm_ManLatchMax(pRtm);
        printf("Performed %d %s latch moves of max depth %d and max latch count %d.\n",(ulong)uVar1,
               pcVar14,(ulong)uVar2,(ulong)uVar4);
        iVar10 = 0x7e65bc;
        printf("Memory usage = %d.  ",(ulong)(uint)pRtm->nExtraCur);
        Abc_Print(iVar10,"%s =","Time");
        aVar7 = Abc_Clock();
        Abc_Print(iVar10,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
      }
      Vec_PtrFree(pVVar8);
      p_00 = Rtm_ManToAig(pRtm);
      pcVar14 = Abc_UtilStrsav(p->pName);
      p_00->pName = pcVar14;
      pcVar14 = Abc_UtilStrsav(p->pSpec);
      p_00->pSpec = pcVar14;
      Rtm_ManFree(pRtm);
      aVar5 = Abc_Clock();
      pAVar9 = Aig_ManReduceLaches(p_00,fVerbose);
      iVar10 = (int)p_00;
      if (fVerbose != 0) {
        Abc_Print(iVar10,"%s =","Register sharing time");
        aVar7 = Abc_Clock();
        Abc_Print(iVar10,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
      }
      return pAVar9;
    }
    pvVar6 = Vec_PtrEntry(pVVar8,iVar10);
    uVar2 = *(uint *)((long)pvVar6 + 8);
    if ((uVar2 >> 7 & 0xff) != uVar2 >> 0xf) break;
    if (*(int *)((long)pvVar6 + 0x14) != *(int *)((long)pvVar6 + 0x10)) {
      __assert_fail("pObj->nFanouts == pObj->Temp",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRet.c"
                    ,0x361,"Aig_Man_t *Rtm_ManRetime(Aig_Man_t *, int, int, int)");
    }
    *(uint *)((long)pvVar6 + 8) = uVar2 & 0x7fff;
    iVar10 = iVar10 + 1;
  }
  __assert_fail("pObj->nFanins == pObj->Num",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRet.c"
                ,0x360,"Aig_Man_t *Rtm_ManRetime(Aig_Man_t *, int, int, int)");
}

Assistant:

Aig_Man_t * Rtm_ManRetime( Aig_Man_t * p, int fForward, int nStepsMax, int fVerbose )
{
    Vec_Ptr_t * vQueue;
    Aig_Man_t * pNew;
    Rtm_Man_t * pRtm;
    Rtm_Obj_t * pObj, * pNext;
    Aig_Obj_t * pObjAig;
    int i, k, nAutos, Degree, DegreeMax = 0; 
    abctime clk;

    // create the retiming manager
clk = Abc_Clock();
    pRtm = Rtm_ManFromAig( p );
    // set registers
    Aig_ManForEachLoSeq( p, pObjAig, i )
        Rtm_ObjAddFirst( pRtm, Rtm_ObjEdge((Rtm_Obj_t *)pObjAig->pData, 0), fForward? RTM_VAL_ZERO : RTM_VAL_VOID );
    // detect and mark the autonomous components
    if ( fForward )
        nAutos = Rtm_ManMarkAutoFwd( pRtm );
    else
        nAutos = Rtm_ManMarkAutoBwd( pRtm );
    if ( fVerbose )
    {
        printf( "Detected %d autonomous objects. ", nAutos );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // set the current retiming number
    Rtm_ManForEachObj( pRtm, pObj, i )
    {
        assert( pObj->nFanins == pObj->Num );
        assert( pObj->nFanouts == pObj->Temp );
        pObj->Num = 0;
    }

clk = Abc_Clock();
    // put the LOs on the queue
    vQueue = Vec_PtrAlloc( 1000 );
    if ( fForward )
    {
        Aig_ManForEachLoSeq( p, pObjAig, i )
        {
            pObj = (Rtm_Obj_t *)pObjAig->pData;
            if ( pObj->fAuto )
                continue;
            pObj->fMark = 1;
            Vec_PtrPush( vQueue, pObj );
        }
    }
    else
    {
        Aig_ManForEachLiSeq( p, pObjAig, i )
        {
            pObj = (Rtm_Obj_t *)pObjAig->pData;
            if ( pObj->fAuto )
                continue;
            pObj->fMark = 1;
            Vec_PtrPush( vQueue, pObj );
        }
    }
    // perform retiming 
    DegreeMax = 0;
    Vec_PtrForEachEntry( Rtm_Obj_t *, vQueue, pObj, i )
    {
        pObj->fMark = 0;
        // retime the node 
        if ( fForward )
        {
            Rtm_ObjRetimeFwd( pRtm, pObj );
            // check if its fanouts should be retimed
            Rtm_ObjForEachFanout( pObj, pNext, k )
            {
                if ( pNext->fMark ) // skip aleady scheduled
                    continue;
                if ( pNext->Type ) // skip POs
                    continue;
                if ( !Rtm_ObjCheckRetimeFwd( pNext ) ) // skip non-retimable
                    continue;
                Degree = Rtm_ObjGetDegreeFwd( pNext );
                DegreeMax = Abc_MaxInt( DegreeMax, Degree );
                if ( Degree > nStepsMax ) // skip nodes with high degree
                    continue;
                pNext->fMark = 1;
                pNext->Num = Degree;
                Vec_PtrPush( vQueue, pNext );
            }
        }
        else
        {
            Rtm_ObjRetimeBwd( pRtm, pObj );
            // check if its fanouts should be retimed
            Rtm_ObjForEachFanin( pObj, pNext, k )
            {
                if ( pNext->fMark ) // skip aleady scheduled
                    continue;
                if ( pNext->nFanins == 0 ) // skip PIs
                    continue;
                if ( !Rtm_ObjCheckRetimeBwd( pNext ) ) // skip non-retimable
                    continue;
                Degree = Rtm_ObjGetDegreeBwd( pNext );
                DegreeMax = Abc_MaxInt( DegreeMax, Degree );
                if ( Degree > nStepsMax ) // skip nodes with high degree
                    continue;
                pNext->fMark = 1;
                pNext->Num = Degree;
                Vec_PtrPush( vQueue, pNext );
            }
        }
    }

    if ( fVerbose )
    {
        printf( "Performed %d %s latch moves of max depth %d and max latch count %d.\n", 
            Vec_PtrSize(vQueue), fForward? "fwd":"bwd", DegreeMax, Rtm_ManLatchMax(pRtm) );
        printf( "Memory usage = %d.  ", pRtm->nExtraCur );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    Vec_PtrFree( vQueue );

    // get the new manager
    pNew = Rtm_ManToAig( pRtm );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Rtm_ManFree( pRtm );
    // group the registers
clk = Abc_Clock();
    pNew = Aig_ManReduceLaches( pNew, fVerbose );
    if ( fVerbose )
    {
        ABC_PRT( "Register sharing time", Abc_Clock() - clk );
    }
    return pNew;
}